

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<std::complex<float>_>::TimesBetaPlusZ
          (TPZFMatrix<std::complex<float>_> *this,complex<float> beta,
          TPZFMatrix<std::complex<float>_> *z)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  complex<float> *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  undefined8 in_XMM0_Qa;
  float fVar10;
  undefined8 uVar9;
  float fVar11;
  float fVar12;
  
  lVar6 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar6) {
    fVar8 = (float)in_XMM0_Qa;
    fVar10 = (float)((ulong)in_XMM0_Qa >> 0x20);
    pcVar4 = this->fElem;
    lVar5 = *(long *)(beta._M_value + 0x20);
    lVar7 = 0;
    do {
      fVar2 = *(float *)((long)&pcVar4->_M_value + lVar7);
      fVar3 = *(float *)((long)&pcVar4->_M_value + lVar7 + 4);
      fVar11 = fVar2 * fVar8 - fVar3 * fVar10;
      fVar12 = fVar3 * fVar8 + fVar2 * fVar10;
      if ((NAN(fVar11)) && (NAN(fVar12))) {
        uVar9 = __mulsc3(fVar2,fVar3,fVar8);
        fVar11 = (float)uVar9;
        fVar12 = (float)((ulong)uVar9 >> 0x20);
      }
      puVar1 = (undefined8 *)((long)&pcVar4->_M_value + lVar7);
      *puVar1 = CONCAT44(fVar12,fVar11);
      uVar9 = *(undefined8 *)(lVar5 + lVar7);
      *puVar1 = CONCAT44((float)((ulong)uVar9 >> 0x20) + fVar12,(float)uVar9 + fVar11);
      lVar7 = lVar7 + 8;
    } while ((complex<float> *)(puVar1 + 1) < pcVar4 + lVar6);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}